

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<ContractTestOnClassWithOutInvariant_ThatACallToAFailingPreConditionFireTheSetException_Test>
::CreateTest(TestFactoryImpl<ContractTestOnClassWithOutInvariant_ThatACallToAFailingPreConditionFireTheSetException_Test>
             *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x20);
  ContractTestOnClassWithOutInvariant_ThatACallToAFailingPreConditionFireTheSetException_Test::
  ContractTestOnClassWithOutInvariant_ThatACallToAFailingPreConditionFireTheSetException_Test
            ((ContractTestOnClassWithOutInvariant_ThatACallToAFailingPreConditionFireTheSetException_Test
              *)this_00);
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }